

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O3

void __thiscall lf::assemble::UniformFEDofHandler::InitTotalNumDofs(UniformFEDofHandler *this)

{
  size_type sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  sVar1 = this->num_loc_dof_point_;
  (this->num_dofs_)._M_elems[this->kNodeOrd] = sVar1;
  (this->num_dofs_)._M_elems[this->kEdgeOrd] = sVar1 * 2 + this->num_loc_dof_segment_;
  iVar2 = this->num_loc_dof_segment_ + this->num_loc_dof_point_;
  uVar4 = iVar2 * 3 + this->num_loc_dof_tria_;
  this->num_dofs_tria_ = uVar4;
  uVar3 = iVar2 * 4 + this->num_loc_dof_quad_;
  this->num_dofs_quad_ = uVar3;
  if (uVar3 < uVar4) {
    uVar3 = uVar4;
  }
  (this->num_dofs_)._M_elems[this->kCellOrd] = uVar3;
  return;
}

Assistant:

void UniformFEDofHandler::InitTotalNumDofs() {
  num_dofs_[kNodeOrd] = num_loc_dof_point_;
  num_dofs_[kEdgeOrd] = 2 * num_loc_dof_point_ + num_loc_dof_segment_;
  num_dofs_tria_ =
      3 * num_loc_dof_point_ + 3 * num_loc_dof_segment_ + num_loc_dof_tria_;
  num_dofs_quad_ =
      4 * num_loc_dof_point_ + 4 * num_loc_dof_segment_ + num_loc_dof_quad_;
  num_dofs_[kCellOrd] = std::max(num_dofs_tria_, num_dofs_quad_);
}